

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

void * sys_realloc(void *mem,size_t prev_len,size_t new_len)

{
  void *__addr;
  void *local_30;
  void *result;
  size_t new_len_local;
  size_t prev_len_local;
  void *mem_local;
  
  if (prev_len < new_len) {
    mem_local = mremap(mem,prev_len,new_len,0);
    if (mem_local == (void *)0xffffffffffffffff) {
      __addr = mmap((void *)((long)mem + prev_len),new_len - prev_len,3,0x22,-1,0);
      local_30 = mem;
      if (__addr != (void *)((long)mem + prev_len)) {
        munmap(__addr,new_len - prev_len);
        local_30 = sys_alloc(new_len,'\x01');
        if (local_30 == (void *)0x0) {
          return (void *)0x0;
        }
        fio_memcpy(local_30,mem,prev_len >> 4);
        munmap(mem,prev_len);
      }
      mem_local = local_30;
    }
  }
  else {
    mem_local = mem;
    if (new_len + 0x1000 < prev_len) {
      munmap((void *)((long)mem + new_len),prev_len - new_len);
    }
  }
  return mem_local;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}